

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Identifier.hpp
# Opt level: O1

void __thiscall Centaurus::Identifier::Identifier(Identifier *this,Stream *stream)

{
  this->_vptr_Identifier = (_func_int **)&PTR__Identifier_001a6cd8;
  (this->m_id)._M_dataplus._M_p = (pointer)&(this->m_id).field_2;
  (this->m_id)._M_string_length = 0;
  (this->m_id).field_2._M_local_buf[0] = L'\0';
  parse(this,stream);
  return;
}

Assistant:

Identifier(Stream& stream)
    {
        parse(stream);
    }